

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeIncrVacuum(Btree *p)

{
  int *piVar1;
  Pgno nOrig;
  BtShared *pBt;
  sqlite3_mutex *psVar2;
  Pgno nFin;
  int iVar3;
  uint uVar4;
  BtCursor *pBVar5;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  iVar3 = 0x65;
  if (pBt->autoVacuum != '\0') {
    nOrig = pBt->nPage;
    uVar4 = *(uint *)(pBt->pPage1->aData + 0x24);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    nFin = finalDbSize(pBt,nOrig,uVar4);
    if (nOrig < nFin) {
      iVar3 = 0xb;
      sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xcdce,
                  "118a3b35693b134d56ebd780123b7fd6f1497668");
    }
    else if (uVar4 != 0) {
      iVar3 = saveAllCursors(pBt,0,(BtCursor *)0x0);
      if (iVar3 == 0) {
        for (pBVar5 = pBt->pCursor; pBVar5 != (BtCursor *)0x0; pBVar5 = pBVar5->pNext) {
          sqlite3_free(pBVar5->aOverflow);
          pBVar5->aOverflow = (Pgno *)0x0;
        }
        iVar3 = incrVacuumStep(pBt,nFin,nOrig,0);
      }
      if (iVar3 == 0) {
        iVar3 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
        uVar4 = pBt->nPage;
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
    }
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar2 = p->pBt->mutex;
      if (psVar2 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar2);
      }
      p->locked = '\0';
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIncrVacuum(Btree *p){
  int rc;
  BtShared *pBt = p->pBt;

  sqlite3BtreeEnter(p);
  assert( pBt->inTransaction==TRANS_WRITE && p->inTrans==TRANS_WRITE );
  if( !pBt->autoVacuum ){
    rc = SQLITE_DONE;
  }else{
    Pgno nOrig = btreePagecount(pBt);
    Pgno nFree = get4byte(&pBt->pPage1->aData[36]);
    Pgno nFin = finalDbSize(pBt, nOrig, nFree);

    if( nOrig<nFin ){
      rc = SQLITE_CORRUPT_BKPT;
    }else if( nFree>0 ){
      rc = saveAllCursors(pBt, 0, 0);
      if( rc==SQLITE_OK ){
        invalidateAllOverflowCache(pBt);
        rc = incrVacuumStep(pBt, nFin, nOrig, 0);
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
        put4byte(&pBt->pPage1->aData[28], pBt->nPage);
      }
    }else{
      rc = SQLITE_DONE;
    }
  }
  sqlite3BtreeLeave(p);
  return rc;
}